

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize,int extDict)

{
  void *pvVar1;
  rawSeq *prVar2;
  BYTE *pBVar3;
  int iVar4;
  int iVar5;
  ZSTD_blockCompressor p_Var6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  undefined8 *puVar10;
  seqDef *psVar11;
  uint uVar12;
  uint uVar13;
  BYTE *pBVar14;
  U32 UVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  
  uVar9 = cParams->searchLength;
  p_Var6 = ZSTD_selectBlockCompressor(cParams->strategy,extDict);
  pvVar1 = (void *)((long)src + srcSize);
  uVar16 = rawSeqStore->pos;
  iVar4 = (int)(ms->window).base;
  iVar5 = iVar4;
  if (0 < (long)srcSize && uVar16 < rawSeqStore->size) {
    do {
      prVar2 = rawSeqStore->seq + uVar16;
      uVar17._0_4_ = prVar2->offset;
      uVar17._4_4_ = prVar2->litLength;
      uVar19 = uVar17 >> 0x20;
      uVar13 = rawSeqStore->seq[uVar16].matchLength;
      uVar8 = (uint)((long)pvVar1 - (long)src);
      if (uVar8 < uVar13 + uVar17._4_4_) {
        uVar16 = uVar17;
        if (uVar8 - uVar17._4_4_ < uVar9) {
          uVar16 = 0;
        }
        uVar12 = uVar8 - uVar17._4_4_;
        if (uVar8 < (uint)uVar17._4_4_ || uVar8 - uVar17._4_4_ == 0) {
          uVar16 = 0;
          uVar12 = uVar13;
        }
        uVar13 = uVar12;
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar1 - (long)src & 0xffffffff,uVar9);
        uVar17 = uVar16;
      }
      else {
        rawSeqStore->pos = uVar16 + 1;
      }
      iVar5 = (int)(ms->window).base;
      UVar15 = (U32)uVar17;
      if (UVar15 == 0) goto LAB_0016d98d;
      uVar8 = (int)src - iVar5;
      if (ms->nextToUpdate + 0x400 < uVar8) {
        uVar12 = (uVar8 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar12) {
          uVar12 = 0x200;
        }
        ms->nextToUpdate = uVar8 - uVar12;
      }
      ZSTD_ldm_fillFastTables(ms,cParams,src);
      sVar7 = (*p_Var6)(ms,seqStore,rep,cParams,src,uVar19);
      lVar18 = (long)src + uVar19;
      ms->nextToUpdate = (int)lVar18 - iVar4;
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar15;
      puVar10 = (undefined8 *)(lVar18 - sVar7);
      pBVar14 = seqStore->lit;
      pBVar3 = pBVar14 + sVar7;
      do {
        *(undefined8 *)pBVar14 = *puVar10;
        pBVar14 = pBVar14 + 8;
        puVar10 = puVar10 + 1;
      } while (pBVar14 < pBVar3);
      seqStore->lit = seqStore->lit + sVar7;
      if (sVar7 < 0x10000) {
        psVar11 = seqStore->sequences;
      }
      else {
        seqStore->longLengthID = 1;
        psVar11 = seqStore->sequences;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar11->litLength = (U16)sVar7;
      psVar11->offset = UVar15 + 3;
      if (0xffff < uVar13 - 3) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar11->matchLength = (U16)(uVar13 - 3);
      seqStore->sequences = psVar11 + 1;
      src = (void *)(lVar18 + (ulong)uVar13);
      uVar16 = rawSeqStore->pos;
    } while ((uVar16 < rawSeqStore->size) && (src < pvVar1));
    iVar5 = (int)(ms->window).base;
  }
LAB_0016d98d:
  uVar9 = (int)src - iVar5;
  if (ms->nextToUpdate + 0x400 < uVar9) {
    uVar13 = (uVar9 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar13) {
      uVar13 = 0x200;
    }
    ms->nextToUpdate = uVar9 - uVar13;
  }
  ZSTD_ldm_fillFastTables(ms,cParams,src);
  sVar7 = (*p_Var6)(ms,seqStore,rep,cParams,src,(long)pvVar1 - (long)src);
  ms->nextToUpdate = (int)pvVar1 - iVar4;
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize,
    int const extDict)
{
    unsigned const minMatch = cParams->searchLength;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, extDict);
    BYTE const* const base = ms->window.base;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, cParams, ip);
        /* Run the block compressor */
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, cParams, ip,
                                sequence.litLength);
            ip += sequence.litLength;
            ms->nextToUpdate = (U32)(ip - base);
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, cParams, ip);
    /* Compress the last literals */
    {
        size_t const lastLiterals = blockCompressor(ms, seqStore, rep, cParams,
                                                    ip, iend - ip);
        ms->nextToUpdate = (U32)(iend - base);
        return lastLiterals;
    }
}